

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::isEncrypted(WalletLoaderImpl *this,string *wallet_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  WalletDatabase *pWVar3;
  pointer psVar4;
  bool bVar5;
  pointer *__ptr;
  long lVar6;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  __it_00;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> db;
  DatabaseStatus status;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  wallets;
  bilingual_str error;
  DatabaseOptions options;
  WalletBatch local_f8;
  WalletDatabase *local_e8;
  DatabaseStatus local_dc;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_d8;
  bilingual_str local_c0;
  DatabaseOptions local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets(&local_d8,&this->m_context);
  psVar4 = local_d8.
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)local_d8.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  __it_00._M_current =
       local_d8.
       super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_80._0_8_ = wallet_name;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
              ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                            *)&local_80,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar5) goto LAB_001d6c69;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
              ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                            *)&local_80,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar5) goto LAB_001d6c69;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
              ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                            *)&local_80,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar5) goto LAB_001d6c69;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
              ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                            *)&local_80,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar5) goto LAB_001d6c69;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)psVar4 - (long)__it_00._M_current >> 4;
  if (lVar6 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar6 != 2) {
      __it._M_current = psVar4;
      if ((lVar6 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
                  ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                                *)&local_80,__it_00), __it._M_current = __it_00._M_current, bVar5))
      goto LAB_001d6c69;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,__it);
    if (bVar5) goto LAB_001d6c69;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
          ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                        *)&local_80,__it_00);
  __it._M_current = psVar4;
  if (bVar5) {
    __it._M_current = __it_00._M_current;
  }
LAB_001d6c69:
  if (__it._M_current ==
      local_d8.
      super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_80.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
    local_80.create_flags = 0;
    lVar6 = (long)&local_80.create_passphrase.field_2;
    local_80.create_passphrase._M_string_length = 0;
    local_80.create_passphrase.field_2._M_local_buf[0] = '\0';
    local_80.verify = true;
    local_80.use_unsafe_sync = false;
    local_80.use_shared_memory = false;
    local_80.max_log_mb = 100;
    local_80._0_2_ = 1;
    paVar1 = &local_c0.original.field_2;
    local_c0.original._M_string_length = 0;
    local_c0.original.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_c0.translated.field_2;
    local_c0.translated._M_string_length = 0;
    local_c0.translated.field_2._M_local_buf[0] = '\0';
    local_c0.original._M_dataplus._M_p = (pointer)paVar1;
    local_c0.translated._M_dataplus._M_p = (pointer)paVar2;
    local_80.create_passphrase._M_dataplus._M_p = (pointer)lVar6;
    MakeWalletDatabase((wallet *)&local_e8,(string *)wallet_name,&local_80,&local_dc,&local_c0);
    pWVar3 = local_e8;
    if (local_e8 == (WalletDatabase *)0x0) {
      bVar5 = false;
    }
    else {
      (*local_e8->_vptr_WalletDatabase[0xe])(&local_f8,local_e8,1);
      local_f8.m_database = pWVar3;
      bVar5 = WalletBatch::IsEncrypted(&local_f8);
      if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
          local_f8.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (DatabaseBatch *)0x0) {
        (*(*(_func_int ***)
            local_f8.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
    }
    if (local_e8 != (WalletDatabase *)0x0) {
      (*local_e8->_vptr_WalletDatabase[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0.translated._M_dataplus._M_p,
                      CONCAT71(local_c0.translated.field_2._M_allocated_capacity._1_7_,
                               local_c0.translated.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.original._M_dataplus._M_p,
                      CONCAT71(local_c0.original.field_2._M_allocated_capacity._1_7_,
                               local_c0.original.field_2._M_local_buf[0]) + 1);
    }
    if (local_80.create_passphrase._M_dataplus._M_p != (pointer)lVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
                ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                 ((long)&local_80 + 0x18),
                 CONCAT71(local_80.create_passphrase.field_2._M_allocated_capacity._1_7_,
                          local_80.create_passphrase.field_2._M_local_buf[0]));
    }
  }
  else {
    bVar5 = CWallet::IsCrypted(((__it._M_current)->
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool isEncrypted(const std::string& wallet_name) override
    {
        auto wallets{GetWallets(m_context)};
        auto it = std::find_if(wallets.begin(), wallets.end(), [&](std::shared_ptr<CWallet> w){ return w->GetName() == wallet_name; });
        if (it != wallets.end()) return (*it)->IsCrypted();

        // Unloaded wallet, read db
        DatabaseOptions options;
        options.require_existing = true;
        DatabaseStatus status;
        bilingual_str error;
        auto db = MakeWalletDatabase(wallet_name, options, status, error);
        if (!db) return false;
        return WalletBatch(*db).IsEncrypted();
    }